

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffie-hellman.c
# Opt level: O1

dh_ctx * dh_setup_gex(mp_int *pval,mp_int *gval)

{
  dh_ctx *pdVar1;
  mp_int *pmVar2;
  
  pdVar1 = (dh_ctx *)safemalloc(1,0x28,0);
  pmVar2 = mp_copy(pval);
  pdVar1->p = pmVar2;
  pmVar2 = mp_copy(gval);
  pdVar1->g = pmVar2;
  pmVar2 = mp_rshift_fixed(pdVar1->p,1);
  pdVar1->q = pmVar2;
  pdVar1->x = (mp_int *)0x0;
  pdVar1->e = (mp_int *)0x0;
  return pdVar1;
}

Assistant:

dh_ctx *dh_setup_gex(mp_int *pval, mp_int *gval)
{
    dh_ctx *ctx = snew(dh_ctx);
    ctx->p = mp_copy(pval);
    ctx->g = mp_copy(gval);
    dh_init(ctx);
    return ctx;
}